

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

DdNode * cuddHashTableLookup(DdHashTable *hash,DdNodePtr *key)

{
  ptrint *ppVar1;
  int *piVar2;
  DdHashItem **ppDVar3;
  DdNode *pDVar4;
  DdHashItem **ppDVar5;
  uint uVar6;
  DdHashItem *pDVar7;
  ulong uVar8;
  ulong uVar9;
  DdHashItem *pDVar10;
  DdHashItem *pDVar11;
  
  uVar8 = (ulong)hash->keysize;
  uVar6 = *(int *)key * 0x40f1f9;
  if (1 < uVar8) {
    uVar9 = 1;
    do {
      uVar6 = uVar6 * 0xc00005 + *(int *)(key + uVar9);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar6 = uVar6 >> ((byte)hash->shift & 0x1f);
  ppDVar3 = hash->bucket;
  pDVar10 = ppDVar3[uVar6];
  if (pDVar10 != (DdHashItem *)0x0) {
    pDVar11 = (DdHashItem *)0x0;
    pDVar7 = pDVar10;
    do {
      if (uVar8 == 0) {
        pDVar11 = (DdHashItem *)0x0;
        pDVar7 = pDVar10;
LAB_0080ae1b:
        pDVar4 = pDVar7->value;
        ppVar1 = &pDVar7->count;
        *ppVar1 = *ppVar1 + -1;
        if (*ppVar1 == 0) {
          piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + -1;
          pDVar10 = (DdHashItem *)(ppDVar3 + uVar6);
          if (pDVar11 != (DdHashItem *)0x0) {
            pDVar10 = pDVar11;
          }
          pDVar10->next = pDVar7->next;
          pDVar7->next = hash->nextFree;
          hash->nextFree = pDVar7;
          hash->size = hash->size - 1;
          return pDVar4;
        }
        return pDVar4;
      }
      uVar9 = 0;
      while (key[uVar9] == pDVar7->key[uVar9]) {
        uVar9 = uVar9 + 1;
        if (uVar8 == uVar9) goto LAB_0080ae1b;
      }
      ppDVar5 = &pDVar7->next;
      pDVar11 = pDVar7;
      pDVar7 = *ppDVar5;
    } while (*ppDVar5 != (DdHashItem *)0x0);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddHashTableLookup(
  DdHashTable * hash,
  DdNodePtr * key)
{
    unsigned int posn;
    DdHashItem *item, *prev;
    unsigned int i, keysize;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    posn = ddLCHash(key,hash->keysize,hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    keysize = hash->keysize;
    while (item != NULL) {
        DdNodePtr *key2 = item->key;
        int equal = 1;
        for (i = 0; i < keysize; i++) {
            if (key[i] != key2[i]) {
                equal = 0;
                break;
            }
        }
        if (equal) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}